

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeCommandListCreateCloneExp
          (ze_command_list_handle_t hCommandList,ze_command_list_handle_t *phClonedCommandList)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeCommandListCreateCloneExp(hCommandList, phClonedCommandList)",
             &local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0x338) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0x338);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeCommandListCreateCloneExpPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar2 + 0xd48),hCommandList,
                                phClonedCommandList), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hCommandList,phClonedCommandList);
          lVar4 = 0;
          goto LAB_00158f31;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
      result = (**(code **)(*plVar1 + 0xc30))(plVar1,hCommandList,phClonedCommandList);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00158f5e;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0xc38))(plVar1,hCommandList,phClonedCommandList,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00158f31:
    if (lVar5 == lVar4) {
      result = zVar3;
      if (((zVar3 == ZE_RESULT_SUCCESS) && (phClonedCommandList != (ze_command_list_handle_t *)0x0))
         && (*(char *)(lVar2 + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(lVar2 + 0xd48),*phClonedCommandList,true);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hCommandList,*phClonedCommandList);
      }
      break;
    }
  }
LAB_00158f5e:
  logAndPropagateResult("zeCommandListCreateCloneExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreateCloneExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle to source command list (the command list to clone)
        ze_command_list_handle_t* phClonedCommandList   ///< [out] pointer to handle of the cloned command list
        )
    {
        context.logger->log_trace("zeCommandListCreateCloneExp(hCommandList, phClonedCommandList)");

        auto pfnCreateCloneExp = context.zeDdiTable.CommandListExp.pfnCreateCloneExp;

        if( nullptr == pfnCreateCloneExp )
            return logAndPropagateResult("zeCommandListCreateCloneExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateCloneExpPrologue( hCommandList, phClonedCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateCloneExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreateCloneExpPrologue( hCommandList, phClonedCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateCloneExp", result);
        }

        auto driver_result = pfnCreateCloneExp( hCommandList, phClonedCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateCloneExpEpilogue( hCommandList, phClonedCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreateCloneExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phClonedCommandList){
                context.handleLifetime->addHandle( *phClonedCommandList );
                context.handleLifetime->addDependent( hCommandList, *phClonedCommandList );

            }
        }
        return logAndPropagateResult("zeCommandListCreateCloneExp", driver_result);
    }